

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::make(Path *this,Value *root)

{
  bool bVar1;
  reference key;
  PathArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  Args *__range1;
  Value *node;
  Value *root_local;
  Path *this_local;
  
  __end1 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_)
  ;
  arg = (PathArgument *)
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
  __range1 = (Args *)root;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                                     *)&arg), bVar1) {
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&__end1);
    if (key->kind_ == kindIndex) {
      Value::isArray((Value *)__range1);
      __range1 = (Args *)Value::operator[]((Value *)__range1,key->index_);
    }
    else if (key->kind_ == kindKey) {
      Value::isObject((Value *)__range1);
      __range1 = (Args *)Value::operator[]((Value *)__range1,&key->key_);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&__end1);
  }
  return (Value *)__range1;
}

Assistant:

Value& Path::make(Value& root) const {
  Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray()) {
        // Error: node is not an array at position ...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: node is not an object at position...
      }
      node = &((*node)[arg.key_]);
    }
  }
  return *node;
}